

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O3

void __thiscall
pbrt::PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,CameraBaseParameters *baseParameters,Float fov,
          Bounds2f *screenWindow,Float lensRadius,Float focalDistance)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  float fVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  Float FVar8;
  Float FVar9;
  Float FVar10;
  Float FVar11;
  Float FVar12;
  float fVar13;
  Float FVar14;
  Float FVar15;
  undefined8 uVar16;
  ulong uVar17;
  bool bVar18;
  ulong *puVar19;
  bool bVar20;
  bool bVar21;
  uintptr_t iptr;
  undefined1 uVar22;
  byte bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auStack_408 [4];
  Float local_404;
  Float local_400;
  Float local_3fc;
  CameraHandle local_3f8;
  Transform local_3f0;
  CameraBaseParameters local_370;
  
  bVar23 = &stack0x00000000 == (undefined1 *)0x408;
  uVar22 = (POPCOUNT((ulong)auStack_408 & 0xff) & 1U) == 0;
  local_404 = fov;
  local_400 = lensRadius;
  local_3fc = focalDistance;
  memcpy(&local_370,baseParameters,0x340);
  local_370.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (baseParameters->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_370.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(baseParameters->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  Perspective(&local_3f0,local_404,0.01,1000.0);
  ProjectiveCamera::ProjectiveCamera
            (&this->super_ProjectiveCamera,&local_370,&local_3f0,screenWindow,local_400,local_3fc);
  FVar1 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][1];
  FVar2 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0];
  FVar3 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2];
  auVar36 = ZEXT816(0) << 0x40;
  fVar4 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][3];
  FVar5 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1];
  FVar6 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1];
  FVar7 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][1];
  FVar8 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0];
  FVar9 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0];
  FVar10 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2];
  FVar11 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2];
  FVar12 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2];
  fVar13 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3];
  fVar24 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  FVar14 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3];
  auVar25 = vmulss_avx512f(ZEXT416((uint)FVar1),auVar36);
  auVar26 = vmulss_avx512f(ZEXT416((uint)FVar6),auVar36);
  auVar27 = vmulss_avx512f(ZEXT416((uint)FVar7),auVar36);
  auVar28 = vmulss_avx512f(ZEXT416((uint)FVar5),auVar36);
  auVar29 = vaddss_avx512f(ZEXT416((uint)FVar2),auVar25);
  auVar30 = vaddss_avx512f(ZEXT416((uint)FVar8),auVar26);
  auVar31 = vaddss_avx512f(ZEXT416((uint)FVar9),auVar27);
  auVar32 = vfmadd231ss_avx512f(auVar25,ZEXT416((uint)FVar2),auVar36);
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)FVar9),auVar36);
  auVar33 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)FVar8),auVar36);
  auVar25 = vfmadd231ss_fma(auVar29,ZEXT416((uint)FVar3),auVar36);
  auVar26 = vfmadd231ss_fma(auVar30,ZEXT416((uint)FVar11),auVar36);
  auVar29 = vfmadd231ss_avx512f(auVar31,ZEXT416((uint)FVar12),auVar36);
  auVar30 = vfmadd231ss_avx512f(auVar32,ZEXT416((uint)FVar3),auVar36);
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416((uint)FVar12),auVar36);
  auVar31 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)FVar11),auVar36);
  auVar32 = vaddss_avx512f(ZEXT416((uint)fVar4),auVar25);
  FVar15 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0];
  vaddss_avx512f(ZEXT416((uint)FVar14),auVar29);
  auVar29 = vaddss_avx512f(ZEXT416((uint)fVar24),auVar26);
  auVar31 = vaddss_avx512f(ZEXT416((uint)fVar24),auVar31);
  auVar25 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar33 = vdivss_avx512f(auVar32,auVar25);
  auVar26 = vaddss_avx512f(ZEXT416((uint)FVar15),auVar28);
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar15),auVar36);
  bVar20 = (bool)(bVar23 & !(bool)uVar22);
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)FVar10),auVar36);
  auVar28 = vfmadd231ss_avx512f(auVar28,ZEXT416((uint)FVar10),auVar36);
  auVar33._0_4_ = (uint)bVar20 * auVar32._0_4_ + (uint)!bVar20 * auVar33._0_4_;
  auVar26 = vaddss_avx512f(ZEXT416((uint)fVar13),auVar26);
  auVar32 = vdivss_avx512f(auVar26,auVar25);
  auVar25 = vdivss_avx512f(auVar29,auVar25);
  auVar32._0_4_ = (uint)bVar20 * auVar26._0_4_ + (uint)!bVar20 * auVar32._0_4_;
  auVar34._4_12_ = auVar25._4_12_;
  auVar34._0_4_ = (uint)bVar20 * auVar29._0_4_ + (uint)!bVar20 * auVar25._0_4_;
  auVar28 = vaddss_avx512f(ZEXT416((uint)fVar13),auVar28);
  auVar25 = vaddss_avx512f(ZEXT416((uint)FVar14),auVar27);
  auVar26 = vaddss_avx512f(ZEXT416((uint)fVar4),auVar30);
  auVar27 = vxorps_avx512vl(auVar27,auVar27);
  auVar44 = ZEXT416((uint)FVar9);
  auVar27 = vfmadd213ss_avx512f(auVar27,auVar44,ZEXT416((uint)FVar7));
  auVar29 = vdivss_avx512f(auVar26,auVar25);
  auVar30 = vdivss_avx512f(auVar28,auVar25);
  auVar25 = vucomiss_avx512f(ZEXT416(0x3f800000));
  auVar31 = vdivss_avx512f(auVar31,auVar25);
  auVar39 = ZEXT416((uint)FVar12);
  auVar25 = vfmadd231ss_avx512f(auVar27,auVar39,auVar36);
  auVar40 = ZEXT416((uint)FVar14);
  vaddss_avx512f(auVar40,auVar25);
  auVar43 = ZEXT416(0x3f800000);
  auVar26 = vucomiss_avx512f(auVar43);
  auVar25 = vxorps_avx512vl(auVar28,auVar28);
  auVar27 = vsubss_avx512f(auVar33,auVar29);
  auVar28 = vsubss_avx512f(auVar32,auVar30);
  auVar45 = ZEXT416((uint)FVar8);
  auVar32 = vfmadd213ss_avx512f(auVar25,auVar45,ZEXT416((uint)FVar6));
  auVar25 = vinsertps_avx512f(auVar27,auVar28,0x10);
  auVar27 = vsubss_avx512f(auVar34,auVar31);
  uVar16 = vmovlps_avx512f(auVar25);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar16;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar16 >> 0x20);
  auVar25 = vxorps_avx512vl(auVar25,auVar25);
  auVar38 = ZEXT416((uint)FVar11);
  auVar28 = vfmadd231ss_avx512f(auVar32,auVar38,auVar36);
  auVar32 = ZEXT416((uint)FVar2);
  auVar25 = vfmadd213ss_avx512f(auVar25,auVar32,ZEXT416((uint)FVar1));
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar27._0_4_;
  auVar27 = vxorps_avx512vl(auVar27,auVar27);
  auVar34 = ZEXT416((uint)FVar15);
  auVar27 = vfmadd213ss_avx512f(auVar27,auVar34,ZEXT416((uint)FVar5));
  auVar28 = vaddss_avx512f(ZEXT416((uint)fVar24),auVar28);
  auVar33 = ZEXT416((uint)FVar3);
  auVar25 = vfmadd231ss_avx512f(auVar25,auVar33,auVar36);
  auVar37 = ZEXT416((uint)FVar10);
  auVar27 = vfmadd231ss_avx512f(auVar27,auVar37,auVar36);
  auVar25 = vaddss_avx512f(ZEXT416((uint)fVar4),auVar25);
  auVar27 = vaddss_avx512f(ZEXT416((uint)fVar13),auVar27);
  auVar25 = vdivss_avx512f(auVar25,auVar26);
  auVar27 = vdivss_avx512f(auVar27,auVar26);
  auVar26 = vdivss_avx512f(auVar28,auVar26);
  auVar25 = vsubss_avx512f(auVar25,auVar29);
  auVar27 = vsubss_avx512f(auVar27,auVar30);
  auVar25 = vinsertps_avx512f(auVar25,auVar27,0x10);
  auVar26 = vsubss_avx512f(auVar26,auVar31);
  uVar16 = vmovlps_avx512f(auVar25);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar16;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar16 >> 0x20);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar26._0_4_;
  puVar19 = (ulong *)((this->super_ProjectiveCamera).super_CameraBase.film.
                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff);
  uVar17 = *(ulong *)(puVar19[3] & 0xffffffffffff);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar17;
  auVar25 = vmovshdup_avx512vl(auVar41);
  auVar26 = vmulss_avx512f(ZEXT416((uint)FVar1),auVar25);
  auVar27 = vmulss_avx512f(ZEXT416((uint)FVar5),auVar25);
  auVar28 = vmulss_avx512f(ZEXT416((uint)FVar6),auVar25);
  auVar25 = vmulss_avx512f(ZEXT416((uint)FVar7),auVar25);
  auVar27 = vfnmsub231ss_avx512f(auVar27,auVar34,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar17;
  auVar25 = vfnmsub231ss_avx512f(auVar25,auVar44,auVar42);
  auVar26 = vfnmsub231ss_avx512f(auVar26,auVar32,auVar42);
  auVar28 = vfnmsub231ss_avx512f(auVar28,auVar45,auVar42);
  auVar27 = vfmadd231ss_avx512f(auVar27,auVar37,auVar36);
  auVar25 = vfmadd231ss_avx512f(auVar25,auVar39,auVar36);
  auVar26 = vfmadd231ss_avx512f(auVar26,auVar33,auVar36);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar38,auVar36);
  auVar25 = vaddss_avx512f(auVar40,auVar25);
  auVar27 = vaddss_avx512f(ZEXT416((uint)fVar13),auVar27);
  auVar26 = vaddss_avx512f(ZEXT416((uint)fVar4),auVar26);
  auVar28 = vaddss_avx512f(ZEXT416((uint)fVar24),auVar28);
  auVar27 = vdivss_avx512f(auVar27,auVar25);
  auVar25 = vucomiss_avx512f(auVar43);
  auVar26 = vdivss_avx512f(auVar26,auVar25);
  auVar25 = vdivss_avx512f(auVar28,auVar25);
  auVar27 = vmulss_avx512f(auVar27,auVar27);
  auVar26 = vfmadd231ss_avx512f(auVar27,auVar26,auVar26);
  auVar26 = vfmadd231ss_avx512f(auVar26,auVar25,auVar25);
  auVar26 = vsqrtss_avx512f(auVar26,auVar26);
  auVar25 = vdivss_avx512f(auVar25,auVar26);
  this->cosTotalWidth = auVar25._0_4_;
  uVar17 = *puVar19;
  auVar25 = vcvtsi2ss_avx512f(auVar36,(int)uVar17);
  bVar20 = uVar17 >> 0x20 == 0;
  bVar18 = (POPCOUNT(uVar17 >> 0x20 & 0xff) & 1U) != 0;
  auVar26 = vcvtsi2ss_avx512f(auVar36,(int)(uVar17 >> 0x20));
  auVar27 = vmulss_avx512f(ZEXT416((uint)FVar1),auVar26);
  auVar27 = vfmadd231ss_avx512f(auVar27,auVar25,auVar32);
  auVar27 = vfmadd231ss_fma(auVar27,auVar36,auVar33);
  auVar28 = vmulss_avx512f(ZEXT416((uint)FVar6),auVar26);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar25,auVar45);
  fVar4 = fVar4 + auVar27._0_4_;
  auVar27 = vmulss_avx512f(ZEXT416((uint)FVar5),auVar26);
  auVar27 = vfmadd231ss_avx512f(auVar27,auVar25,auVar34);
  auVar32 = vmulss_avx512f(ZEXT416((uint)FVar7),auVar26);
  auVar26 = vfmadd231ss_fma(auVar28,auVar36,auVar38);
  auVar28 = vfmadd231ss_avx512f(auVar32,auVar44,auVar25);
  auVar25 = vfmadd231ss_fma(auVar27,auVar36,auVar37);
  fVar24 = fVar24 + auVar26._0_4_;
  auVar26 = vfmadd231ss_fma(auVar28,auVar39,auVar36);
  fVar13 = fVar13 + auVar25._0_4_;
  vaddss_avx512f(auVar40,auVar26);
  auVar25 = vucomiss_avx512f(auVar43);
  fVar35 = auVar25._0_4_;
  bVar21 = bVar20 && bVar18;
  local_3f8.
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = (TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           )((ulong)this | 0x1000000000000);
  fVar24 = (float)((uint)bVar21 * (int)fVar24 + (uint)(!bVar20 || !bVar18) * (int)(fVar24 / fVar35))
  ;
  auVar26 = vdivss_avx512f(auVar29,auVar31);
  auVar27 = vdivss_avx512f(auVar30,auVar31);
  auVar25._8_4_ = 0x7fffffff;
  auVar25._0_8_ = 0x7fffffff7fffffff;
  auVar25._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx512vl(ZEXT416((uint)(((float)((uint)bVar21 * (int)fVar4 +
                                                   (uint)(!bVar20 || !bVar18) *
                                                   (int)(fVar4 / fVar35)) / fVar24 - auVar26._0_4_)
                                          * ((float)((uint)bVar21 * (int)fVar13 +
                                                    (uint)(!bVar20 || !bVar18) *
                                                    (int)(fVar13 / fVar35)) / fVar24 - auVar27._0_4_
                                            ))),auVar25);
  this->A = auVar25._0_4_;
  CameraBase::FindMinimumDifferentials((CameraBase *)this,&local_3f8);
  return;
}

Assistant:

PerspectiveCamera(CameraBaseParameters baseParameters, Float fov,
                      const Bounds2f &screenWindow, Float lensRadius, Float focalDistance)
        : ProjectiveCamera(baseParameters, Perspective(fov, 1e-2f, 1000.f), screenWindow,
                           lensRadius, focalDistance) {
        // Compute differential changes in origin for perspective camera rays
        dxCamera =
            cameraFromRaster(Point3f(1, 0, 0)) - cameraFromRaster(Point3f(0, 0, 0));
        dyCamera =
            cameraFromRaster(Point3f(0, 1, 0)) - cameraFromRaster(Point3f(0, 0, 0));

        // Compute _cosTotalWidth_ for perspective camera
        Point2f radius = Point2f(film.GetFilter().Radius());
        Point3f pCorner(-radius.x, -radius.y, 0.f);
        Vector3f wCornerCamera = Normalize(Vector3f(cameraFromRaster(pCorner)));
        cosTotalWidth = wCornerCamera.z;
        DCHECK_LT(.9999 * cosTotalWidth, std::cos(Radians(fov / 2)));

        // Compute image plane bounds at $z=1$ for _PerspectiveCamera_
        Point2i res = film.FullResolution();
        Point3f pMin = cameraFromRaster(Point3f(0, 0, 0));
        Point3f pMax = cameraFromRaster(Point3f(res.x, res.y, 0));
        pMin /= pMin.z;
        pMax /= pMax.z;
        A = std::abs((pMax.x - pMin.x) * (pMax.y - pMin.y));

        // Compute minimum differentials for _PerspectiveCamera_
        FindMinimumDifferentials(this);
    }